

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O3

int b_or(lua_State *L)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int arg;
  ulong uVar4;
  
  iVar2 = lua_gettop(L);
  if (iVar2 < 1) {
    uVar4 = 0;
  }
  else {
    arg = 1;
    uVar4 = 0;
    do {
      uVar3 = luaL_checkinteger(L,arg);
      iVar1 = (1 - iVar2) + arg;
      arg = arg + 1;
      uVar4 = uVar4 | uVar3;
    } while (iVar1 != 1);
    uVar4 = uVar4 & 0xffffffff;
  }
  lua_pushinteger(L,uVar4);
  return 1;
}

Assistant:

static int b_or (lua_State *L) {
  int i, n = lua_gettop(L);
  lua_Unsigned r = 0;
  for (i = 1; i <= n; i++)
    r |= checkunsigned(L, i);
  pushunsigned(L, trim(r));
  return 1;
}